

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slicing.h
# Opt level: O2

void __thiscall
dg::Slicer<dg::LLVMNode>::sliceBBlocks
          (Slicer<dg::LLVMNode> *this,DependenceGraph<dg::LLVMNode> *graph,uint32_t sl_id)

{
  uint32_t *puVar1;
  _Rb_tree_header *p_Var2;
  size_t sVar3;
  BBlock<dg::LLVMNode> *this_00;
  int iVar4;
  _Base_ptr p_Var5;
  _Rb_tree_node_base *p_Var6;
  undefined1 auVar7 [16];
  set<dg::BBlock<dg::LLVMNode>_*,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
  blocks;
  
  p_Var2 = &blocks._M_t._M_impl.super__Rb_tree_header;
  blocks._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  blocks._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  blocks._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var5 = (graph->_blocks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  blocks._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  blocks._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  for (; p_Var6 = blocks._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
      (_Rb_tree_header *)p_Var5 != &(graph->_blocks)._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
    if (p_Var5[1]._M_parent[0xd]._M_right != (_Base_ptr)(ulong)sl_id) {
      std::
      _Rb_tree<dg::BBlock<dg::LLVMNode>*,dg::BBlock<dg::LLVMNode>*,std::_Identity<dg::BBlock<dg::LLVMNode>*>,std::less<dg::BBlock<dg::LLVMNode>*>,std::allocator<dg::BBlock<dg::LLVMNode>*>>
      ::_M_insert_unique<dg::BBlock<dg::LLVMNode>*const&>
                ((_Rb_tree<dg::BBlock<dg::LLVMNode>*,dg::BBlock<dg::LLVMNode>*,std::_Identity<dg::BBlock<dg::LLVMNode>*>,std::less<dg::BBlock<dg::LLVMNode>*>,std::allocator<dg::BBlock<dg::LLVMNode>*>>
                  *)&blocks,(BBlock<dg::LLVMNode> **)&p_Var5[1]._M_parent);
    }
  }
  for (; (_Rb_tree_header *)p_Var6 != p_Var2;
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
    this_00 = *(BBlock<dg::LLVMNode> **)(p_Var6 + 1);
    sVar3 = (this_00->nodes).super__List_base<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>.
            _M_impl._M_node._M_size;
    auVar7._8_4_ = (int)sVar3;
    auVar7._0_8_ = sVar3;
    auVar7._12_4_ = (int)(sVar3 >> 0x20);
    (this->statistics).nodesTotal = sVar3 + (this->statistics).nodesTotal;
    (this->statistics).nodesRemoved = auVar7._8_8_ + (this->statistics).nodesRemoved;
    puVar1 = &(this->statistics).blocksRemoved;
    *puVar1 = *puVar1 + 1;
    iVar4 = (*this->_vptr_Slicer[1])(this,this_00);
    if ((char)iVar4 != '\0') {
      BBlock<dg::LLVMNode>::remove(this_00,(char *)0x1);
    }
  }
  std::
  _Rb_tree<dg::BBlock<dg::LLVMNode>_*,_dg::BBlock<dg::LLVMNode>_*,_std::_Identity<dg::BBlock<dg::LLVMNode>_*>,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
  ::~_Rb_tree(&blocks._M_t);
  return;
}

Assistant:

void sliceBBlocks(DependenceGraph<NodeT> *graph, uint32_t sl_id) {
        auto &CB = graph->getBlocks();
#ifndef NDEBUG
        uint32_t blocksNum = CB.size();
#endif
        // gather the blocks
        // FIXME: we don't need two loops, just go carefully
        // through the constructed blocks (keep temporary always-valid iterator)
        std::set<BBlock<NodeT> *> blocks;
        for (auto &it : CB) {
            if (it.second->getSlice() != sl_id)
                blocks.insert(it.second);
        }

        for (BBlock<NodeT> *blk : blocks) {
            // update statistics
            statistics.nodesRemoved += blk->size();
            statistics.nodesTotal += blk->size();
            ++statistics.blocksRemoved;

            // call specific handlers (overriden by child class)
            if (removeBlock(blk)) {
                // remove block from the graph
                blk->remove();
            }
        }

        assert(CB.size() + blocks.size() == blocksNum &&
               "Inconsistency in sliced blocks");
    }